

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O3

int __thiscall ncnn::PReLU::load_model(PReLU *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_50;
  int *local_48;
  size_t local_40;
  Allocator *local_38;
  int local_30;
  int iStack_2c;
  int iStack_28;
  int iStack_24;
  size_t local_20;
  
  (**mb->_vptr_ModelBin)(&local_50,mb,(ulong)(uint)this->num_slope,1);
  if (&this->slope_data != (Mat *)&local_50) {
    if (local_48 != (int *)0x0) {
      LOCK();
      *local_48 = *local_48 + 1;
      UNLOCK();
    }
    piVar1 = (this->slope_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->slope_data).data;
        pAVar3 = (this->slope_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(*(void **)((long)pvVar2 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->slope_data).data = local_50;
    (this->slope_data).refcount = local_48;
    (this->slope_data).elemsize = local_40;
    (this->slope_data).allocator = local_38;
    (this->slope_data).dims = local_30;
    (this->slope_data).w = iStack_2c;
    (this->slope_data).h = iStack_28;
    (this->slope_data).c = iStack_24;
    (this->slope_data).cstep = local_20;
  }
  if (local_48 != (int *)0x0) {
    LOCK();
    *local_48 = *local_48 + -1;
    UNLOCK();
    if (*local_48 == 0) {
      if (local_38 == (Allocator *)0x0) {
        if (local_50 != (void *)0x0) {
          free(*(void **)((long)local_50 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_38 + 8))();
      }
    }
  }
  if (((this->slope_data).data == (void *)0x0) ||
     (iVar4 = 0, (long)(this->slope_data).c * (this->slope_data).cstep == 0)) {
    iVar4 = -100;
  }
  return iVar4;
}

Assistant:

int PReLU::load_model(const ModelBin& mb)
{
    slope_data = mb.load(num_slope, 1);
    if (slope_data.empty())
        return -100;

    return 0;
}